

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_AllocateSideDefs(int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  side_t *__s;
  side_t *local_28;
  int local_10;
  int i;
  int count_local;
  
  uVar4 = (ulong)count;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0xd8),0);
  if (SUB168(auVar1 * ZEXT816(0xd8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = (side_t *)operator_new__(uVar5);
  if (uVar4 != 0) {
    local_28 = __s;
    do {
      side_t::side_t(local_28);
      local_28 = local_28 + 1;
    } while (local_28 != __s + uVar4);
  }
  sides = __s;
  memset(__s,0,(long)count * 0xd8);
  iVar3 = MAX<int>(count,numvertexes);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
  if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  sidetemp = (sidei_t *)operator_new__(uVar4);
  for (local_10 = 0; local_10 < count; local_10 = local_10 + 1) {
    sidetemp[local_10].field_0.a.tag = 0;
    sidetemp[local_10].field_0.a.special = 0;
    sidetemp[local_10].field_0.a.alpha = -0x8000;
    sidetemp[local_10].field_0.a.map = 0xffffffff;
  }
  if (count < numsides) {
    Printf("Map has %d unused sidedefs\n",(ulong)(uint)(numsides - count));
  }
  numsides = count;
  sidecount = 0;
  return;
}

Assistant:

static void P_AllocateSideDefs (int count)
{
	int i;

	sides = new side_t[count];
	memset (sides, 0, count*sizeof(side_t));

	sidetemp = new sidei_t[MAX(count,numvertexes)];
	for (i = 0; i < count; i++)
	{
		sidetemp[i].a.special = sidetemp[i].a.tag = 0;
		sidetemp[i].a.alpha = SHRT_MIN;
		sidetemp[i].a.map = NO_SIDE;
	}
	if (count < numsides)
	{
		Printf ("Map has %d unused sidedefs\n", numsides - count);
	}
	numsides = count;
	sidecount = 0;
}